

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_move_data_from_codec_to_output_image(opj_j2k_t *p_j2k,opj_image_t *p_image)

{
  opj_image_comp_t *poVar1;
  opj_image_comp_t *poVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  OPJ_UINT32 OVar9;
  OPJ_UINT32 OVar10;
  opj_image_comp_t *poVar11;
  OPJ_INT32 **ppOVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  
  uVar15 = (ulong)(p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode;
  if (uVar15 == 0) {
    if (p_image->numcomps != 0) {
      lVar14 = 0;
      uVar15 = 0;
      do {
        poVar11 = p_image->comps;
        *(undefined4 *)((long)&poVar11->resno_decoded + lVar14) =
             *(undefined4 *)((long)&p_j2k->m_output_image->comps->resno_decoded + lVar14);
        opj_image_data_free(*(void **)((long)&poVar11->data + lVar14));
        poVar11 = p_j2k->m_output_image->comps;
        *(undefined8 *)((long)&p_image->comps->data + lVar14) =
             *(undefined8 *)((long)&poVar11->data + lVar14);
        *(undefined8 *)((long)&poVar11->data + lVar14) = 0;
        uVar15 = uVar15 + 1;
        lVar14 = lVar14 + 0x40;
      } while (uVar15 < p_image->numcomps);
    }
  }
  else {
    poVar11 = (opj_image_comp_t *)opj_malloc(uVar15 << 6);
    if (poVar11 == (opj_image_comp_t *)0x0) {
      opj_image_destroy(p_j2k->m_private_image);
      p_j2k->m_private_image = (opj_image_t *)0x0;
    }
    else {
      if (p_image->numcomps != 0) {
        lVar14 = 0x30;
        uVar15 = 0;
        do {
          opj_image_data_free(*(void **)((long)&p_image->comps->dx + lVar14));
          *(undefined8 *)((long)&p_image->comps->dx + lVar14) = 0;
          uVar15 = uVar15 + 1;
          lVar14 = lVar14 + 0x40;
        } while (uVar15 < p_image->numcomps);
      }
      if ((p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode != 0) {
        ppOVar12 = &poVar11->data;
        uVar15 = 0;
        do {
          uVar13 = (p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode[uVar15];
          poVar1 = p_j2k->m_output_image->comps;
          poVar2 = poVar1 + uVar13;
          OVar9 = poVar2->dx;
          OVar10 = poVar2->dy;
          uVar3 = *(undefined8 *)&poVar2->w;
          uVar4 = *(undefined8 *)&poVar1[uVar13].x0;
          uVar5 = *(undefined8 *)(&poVar1[uVar13].x0 + 2);
          uVar6 = *(undefined8 *)&poVar1[uVar13].sgnd;
          uVar7 = *(undefined8 *)(&poVar1[uVar13].sgnd + 2);
          uVar8 = (&poVar1[uVar13].data)[1];
          *ppOVar12 = poVar1[uVar13].data;
          ppOVar12[1] = (OPJ_INT32 *)uVar8;
          ppOVar12[-2] = (OPJ_INT32 *)uVar6;
          ppOVar12[-1] = (OPJ_INT32 *)uVar7;
          ppOVar12[-4] = (OPJ_INT32 *)uVar4;
          ppOVar12[-3] = (OPJ_INT32 *)uVar5;
          ((opj_image_comp_t *)(ppOVar12 + -6))->dx = OVar9;
          ((opj_image_comp_t *)(ppOVar12 + -6))->dy = OVar10;
          ppOVar12[-5] = (OPJ_INT32 *)uVar3;
          poVar2 = p_j2k->m_output_image->comps;
          *(OPJ_UINT32 *)((long)ppOVar12 + -0xc) = poVar2[uVar13].resno_decoded;
          *ppOVar12 = poVar2[uVar13].data;
          poVar2[uVar13].data = (OPJ_INT32 *)0x0;
          uVar15 = uVar15 + 1;
          ppOVar12 = ppOVar12 + 8;
        } while (uVar15 < (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode);
      }
      if (p_image->numcomps != 0) {
        uVar13 = 0;
        lVar14 = 0x30;
        do {
          if (*(long *)((long)&p_j2k->m_output_image->comps->dx + lVar14) != 0) {
            __assert_fail("p_j2k->m_output_image->comps[compno].data == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                          ,0x2eb9,
                          "OPJ_BOOL opj_j2k_move_data_from_codec_to_output_image(opj_j2k_t *, opj_image_t *)"
                         );
          }
          opj_image_data_free((void *)0x0);
          *(undefined8 *)((long)&p_j2k->m_output_image->comps->dx + lVar14) = 0;
          uVar13 = uVar13 + 1;
          lVar14 = lVar14 + 0x40;
        } while (uVar13 < p_image->numcomps);
      }
      p_image->numcomps = (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode;
      opj_free(p_image->comps);
      p_image->comps = poVar11;
    }
    if (poVar11 == (opj_image_comp_t *)0x0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static OPJ_BOOL opj_j2k_move_data_from_codec_to_output_image(opj_j2k_t * p_j2k,
        opj_image_t * p_image)
{
    OPJ_UINT32 compno;

    /* Move data and copy one information from codec to output image*/
    if (p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode > 0) {
        opj_image_comp_t* newcomps =
            (opj_image_comp_t*) opj_malloc(
                p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode *
                sizeof(opj_image_comp_t));
        if (newcomps == NULL) {
            opj_image_destroy(p_j2k->m_private_image);
            p_j2k->m_private_image = NULL;
            return OPJ_FALSE;
        }
        for (compno = 0; compno < p_image->numcomps; compno++) {
            opj_image_data_free(p_image->comps[compno].data);
            p_image->comps[compno].data = NULL;
        }
        for (compno = 0;
                compno < p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode; compno++) {
            OPJ_UINT32 src_compno =
                p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode[compno];
            memcpy(&(newcomps[compno]),
                   &(p_j2k->m_output_image->comps[src_compno]),
                   sizeof(opj_image_comp_t));
            newcomps[compno].resno_decoded =
                p_j2k->m_output_image->comps[src_compno].resno_decoded;
            newcomps[compno].data = p_j2k->m_output_image->comps[src_compno].data;
            p_j2k->m_output_image->comps[src_compno].data = NULL;
        }
        for (compno = 0; compno < p_image->numcomps; compno++) {
            assert(p_j2k->m_output_image->comps[compno].data == NULL);
            opj_image_data_free(p_j2k->m_output_image->comps[compno].data);
            p_j2k->m_output_image->comps[compno].data = NULL;
        }
        p_image->numcomps = p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode;
        opj_free(p_image->comps);
        p_image->comps = newcomps;
    } else {
        for (compno = 0; compno < p_image->numcomps; compno++) {
            p_image->comps[compno].resno_decoded =
                p_j2k->m_output_image->comps[compno].resno_decoded;
            opj_image_data_free(p_image->comps[compno].data);
            p_image->comps[compno].data = p_j2k->m_output_image->comps[compno].data;
#if 0
            char fn[256];
            sprintf(fn, "/tmp/%d.raw", compno);
            FILE *debug = fopen(fn, "wb");
            fwrite(p_image->comps[compno].data, sizeof(OPJ_INT32),
                   p_image->comps[compno].w * p_image->comps[compno].h, debug);
            fclose(debug);
#endif
            p_j2k->m_output_image->comps[compno].data = NULL;
        }
    }
    return OPJ_TRUE;
}